

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_uncompressed_header_obu
               (AV1_COMP *cpi,MACROBLOCKD *xd,aom_write_bit_buffer *saved_wb,
               aom_write_bit_buffer *wb)

{
  int iVar1;
  AV1_COMMON *cm_00;
  aom_write_bit_buffer *paVar2;
  AV1_COMMON *in_RCX;
  MACROBLOCKD *in_RSI;
  long *in_RDI;
  int use_hybrid_pred;
  DeltaQInfo *delta_q_info;
  int might_bwd_adapt;
  int delta_frame_id_minus_1;
  int diff_len;
  int frame_id_len_2;
  int i;
  int map_idx;
  int first_ref_map_idx;
  int gld_ref;
  int lst_ref;
  MV_REFERENCE_FRAME ref_frame;
  int ref_idx;
  int op_num;
  int frame_id_len_1;
  int frame_size_override_flag;
  int display_frame_id;
  int frame_id_len;
  FeatureFlags *features;
  CurrentFrame *current_frame;
  CommonQuantParams *quant_params;
  SequenceHeader *seq_params;
  AV1_COMMON *cm;
  int in_stack_ffffffffffffff28;
  uint32_t in_stack_ffffffffffffff2c;
  AV1_COMMON *in_stack_ffffffffffffff30;
  MACROBLOCKD *in_stack_ffffffffffffff38;
  AV1_COMMON *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  aom_write_bit_buffer *wb_00;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  byte bVar3;
  bool local_99;
  uint in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  AV1_COMP *cpi_00;
  int local_70;
  char local_61;
  int local_60;
  int local_5c;
  uint local_54;
  long lVar4;
  AV1_COMMON *cm_01;
  long *plVar5;
  
  cm_00 = (AV1_COMMON *)(in_RDI + 0x77f0);
  lVar4 = in_RDI[0x8401];
  paVar2 = (aom_write_bit_buffer *)(in_RDI + 0x783d);
  if ((((*(byte *)((long)in_RDI + 0x60ddd) & 1) == 0) || (*(int *)(lVar4 + 0x28) == 0)) ||
     (*(int *)(lVar4 + 0x34) != 0)) {
    *(undefined4 *)(in_RDI + 0x77f5) = 0;
  }
  else {
    *(undefined4 *)(in_RDI + 0x77f5) = 1;
  }
  cm_01 = cm_00;
  plVar5 = in_RDI;
  if (*(char *)(lVar4 + 0x3a) == '\0') {
    iVar1 = encode_show_existing_frame(cm_00);
    if (iVar1 != 0) {
      aom_wb_write_bit((aom_write_bit_buffer *)in_RCX,1);
      aom_wb_write_literal
                ((aom_write_bit_buffer *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                 in_stack_ffffffffffffff28);
      if ((*(char *)(lVar4 + 0x10c) != '\0') && (*(int *)(lVar4 + 0x104) == 0)) {
        write_tu_pts_info(in_stack_ffffffffffffff30,
                          (aom_write_bit_buffer *)
                          CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      }
      if (*(char *)(lVar4 + 0x10) == '\0') {
        return;
      }
      aom_wb_write_literal
                ((aom_write_bit_buffer *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                 in_stack_ffffffffffffff28);
      return;
    }
    aom_wb_write_bit((aom_write_bit_buffer *)in_RCX,0);
    aom_wb_write_literal
              ((aom_write_bit_buffer *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
               in_stack_ffffffffffffff28);
    aom_wb_write_bit((aom_write_bit_buffer *)in_RCX,cm_01->show_frame);
    if (cm_01->show_frame == 0) {
      aom_wb_write_bit((aom_write_bit_buffer *)in_RCX,cm_01->showable_frame);
    }
    else if ((*(char *)(lVar4 + 0x10c) != '\0') && (*(int *)(lVar4 + 0x104) == 0)) {
      write_tu_pts_info(in_stack_ffffffffffffff30,
                        (aom_write_bit_buffer *)
                        CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    }
    iVar1 = frame_is_sframe(cm_01);
    if ((iVar1 == 0) && (((cm_00->current_frame).frame_type != '\0' || (cm_01->show_frame == 0)))) {
      aom_wb_write_bit((aom_write_bit_buffer *)in_RCX,(uint)(*(byte *)((long)in_RDI + 0x3c176) & 1))
      ;
    }
  }
  aom_wb_write_bit((aom_write_bit_buffer *)in_RCX,(uint)(*(byte *)((long)in_RDI + 0x3c16c) & 1));
  if (*(char *)(lVar4 + 0x38) == '\x02') {
    aom_wb_write_bit((aom_write_bit_buffer *)in_RCX,(uint)(*(byte *)((long)in_RDI + 0x3c16f) & 1));
  }
  if (((*(byte *)((long)in_RDI + 0x3c16f) & 1) != 0) && (*(char *)(lVar4 + 0x3b) == '\x02')) {
    aom_wb_write_bit((aom_write_bit_buffer *)in_RCX,(uint)(*(byte *)((long)in_RDI + 0x3c16e) & 1));
  }
  local_54 = 0;
  if (*(char *)(lVar4 + 0x3a) == '\0') {
    if (*(char *)(lVar4 + 0x10) != '\0') {
      aom_wb_write_literal
                ((aom_write_bit_buffer *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                 in_stack_ffffffffffffff28);
    }
    if ((*(int *)(lVar4 + 8) < cm_01->superres_upscaled_width) ||
       (*(int *)(lVar4 + 0xc) < cm_01->superres_upscaled_height)) {
      aom_internal_error(cm_01->error,AOM_CODEC_UNSUP_BITSTREAM,
                         "Frame dimensions are larger than the maximum values");
    }
    iVar1 = frame_is_sframe(cm_01);
    if (iVar1 == 0) {
      local_99 = true;
      if (cm_01->superres_upscaled_width == *(int *)(lVar4 + 8)) {
        local_99 = cm_01->superres_upscaled_height != *(int *)(lVar4 + 0xc);
      }
      local_54 = (uint)local_99;
    }
    else {
      local_54 = 1;
    }
    in_stack_ffffffffffffff68 = local_54;
    iVar1 = frame_is_sframe(cm_01);
    if (iVar1 == 0) {
      aom_wb_write_bit((aom_write_bit_buffer *)in_RCX,local_54);
    }
    if (*(int *)(lVar4 + 0x28) != 0) {
      aom_wb_write_literal
                ((aom_write_bit_buffer *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                 in_stack_ffffffffffffff28);
    }
    if (((*(byte *)((long)in_RDI + 0x3c176) & 1) == 0) &&
       (iVar1 = frame_is_intra_only(cm_01), iVar1 == 0)) {
      aom_wb_write_literal
                ((aom_write_bit_buffer *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                 in_stack_ffffffffffffff28);
    }
  }
  if ((*(char *)(lVar4 + 0x10c) != '\0') &&
     (aom_wb_write_bit((aom_write_bit_buffer *)in_RCX,(uint)(*(byte *)(*plVar5 + 0xc754) & 1)),
     (*(byte *)(*plVar5 + 0xc754) & 1) != 0)) {
    for (local_5c = 0; local_5c < *(int *)(lVar4 + 0x70) + 1; local_5c = local_5c + 1) {
      if ((*(int *)(lVar4 + 0x168 + (long)local_5c * 0x30) != 0) &&
         ((*(int *)(lVar4 + 0x74 + (long)local_5c * 4) == 0 ||
          (((*(int *)(lVar4 + 0x74 + (long)local_5c * 4) >> ((byte)cm_01->temporal_layer_id & 0x1f)
            & 1U) != 0 &&
           ((*(int *)(lVar4 + 0x74 + (long)local_5c * 4) >>
             ((char)cm_01->spatial_layer_id + 8U & 0x1f) & 1U) != 0)))))) {
        aom_wb_write_unsigned_literal
                  ((aom_write_bit_buffer *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                   in_stack_ffffffffffffff28);
        cm_01->buffer_removal_times[local_5c] = cm_01->buffer_removal_times[local_5c] + 1;
        if (cm_01->buffer_removal_times[local_5c] == 0) {
          aom_internal_error(cm_01->error,AOM_CODEC_UNSUP_BITSTREAM,"buffer_removal_time overflowed"
                            );
        }
      }
    }
  }
  if (((((cm_00->current_frame).frame_type == '\0') && (cm_01->show_frame == 0)) ||
      ((cm_00->current_frame).frame_type == '\x01')) ||
     ((cm_00->current_frame).frame_type == '\x02')) {
    aom_wb_write_literal
              ((aom_write_bit_buffer *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
               in_stack_ffffffffffffff28);
  }
  iVar1 = frame_is_intra_only(cm_01);
  if (((iVar1 == 0) || (*(int *)((long)in_RDI + 0x3bfa4) != 0xff)) &&
     (((*(byte *)((long)in_RDI + 0x3c176) & 1) != 0 && (*(int *)(lVar4 + 0x28) != 0)))) {
    for (local_60 = 0; local_60 < 8; local_60 = local_60 + 1) {
      aom_wb_write_literal
                ((aom_write_bit_buffer *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                 in_stack_ffffffffffffff28);
    }
  }
  iVar1 = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  if ((cm_00->current_frame).frame_type == '\0') {
    write_frame_size((AV1_COMMON *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                     iVar1,(aom_write_bit_buffer *)in_stack_ffffffffffffff40);
    if (((*(byte *)((long)in_RDI + 0x3c16f) & 1) != 0) &&
       (iVar1 = av1_superres_scaled(cm_01), iVar1 == 0)) {
      aom_wb_write_bit((aom_write_bit_buffer *)in_RCX,(uint)(*(byte *)(in_RDI + 0x782e) & 1));
    }
  }
  else if ((cm_00->current_frame).frame_type == '\x02') {
    write_frame_size((AV1_COMMON *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                     iVar1,(aom_write_bit_buffer *)in_stack_ffffffffffffff40);
    if (((*(byte *)((long)in_RDI + 0x3c16f) & 1) != 0) &&
       (iVar1 = av1_superres_scaled(cm_01), iVar1 == 0)) {
      aom_wb_write_bit((aom_write_bit_buffer *)in_RCX,(uint)(*(byte *)(in_RDI + 0x782e) & 1));
    }
  }
  else if (((cm_00->current_frame).frame_type == '\x01') ||
          (iVar1 = frame_is_sframe(cm_01), iVar1 != 0)) {
    if ((int)in_RDI[0x77f5] != 0) {
      iVar1 = check_frame_refs_short_signaling(cm_01,SUB81((ulong)lVar4 >> 0x38,0));
      *(int *)(in_RDI + 0x77f5) = iVar1;
    }
    if (*(int *)(lVar4 + 0x28) != 0) {
      aom_wb_write_bit((aom_write_bit_buffer *)in_RCX,(int)in_RDI[0x77f5]);
    }
    if ((int)in_RDI[0x77f5] != 0) {
      get_ref_frame_map_idx(cm_01,'\x01');
      aom_wb_write_literal
                ((aom_write_bit_buffer *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                 in_stack_ffffffffffffff28);
      get_ref_frame_map_idx(cm_01,'\x04');
      aom_wb_write_literal
                ((aom_write_bit_buffer *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                 in_stack_ffffffffffffff28);
    }
    local_70 = -1;
    if (*(int *)(*plVar5 + 0x14dc0) != 0) {
      for (local_61 = '\x01'; local_61 < '\b'; local_61 = local_61 + '\x01') {
        if (*(int *)(*plVar5 + 0x14d68 + (long)(local_61 + -1) * 4) == 1) {
          local_70 = *(int *)(*plVar5 + 0x14d84 + (long)(local_61 + -1) * 4);
          break;
        }
      }
    }
    for (local_61 = '\x01'; local_61 < '\b'; local_61 = local_61 + '\x01') {
      if ((int)in_RDI[0x77f5] == 0) {
        if ((((*(int *)(*plVar5 + 0x14dc0) == 0) || (local_70 == -1)) || ((int)plVar5[0x13a67] != 1)
            ) || (*(int *)(lVar4 + 0x28) != 0)) {
          get_ref_frame_map_idx(cm_01,local_61);
          aom_wb_write_literal
                    ((aom_write_bit_buffer *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                     in_stack_ffffffffffffff28);
        }
        else {
          if (*(int *)(*plVar5 + 0x14d68 + (long)(local_61 + -1) * 4) != 0) {
            get_ref_frame_map_idx(cm_01,local_61);
          }
          aom_wb_write_literal
                    ((aom_write_bit_buffer *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                     in_stack_ffffffffffffff28);
        }
      }
      if (*(char *)(lVar4 + 0x10) != '\0') {
        iVar1 = get_ref_frame_map_idx(cm_01,local_61);
        bVar3 = (byte)*(undefined4 *)(lVar4 + 0x14);
        iVar1 = ((cm_01->current_frame_id - cm_01->ref_frame_id[iVar1]) + (1 << (bVar3 & 0x1f))) %
                (1 << (bVar3 & 0x1f)) + -1;
        if ((iVar1 < 0) || (1 << ((byte)*(undefined4 *)(lVar4 + 0x18) & 0x1f) <= iVar1)) {
          aom_internal_error(cm_01->error,AOM_CODEC_ERROR,"Invalid delta_frame_id_minus_1");
        }
        aom_wb_write_literal
                  ((aom_write_bit_buffer *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                   in_stack_ffffffffffffff28);
      }
    }
    if (((*(byte *)((long)in_RDI + 0x3c176) & 1) == 0) && (local_54 != 0)) {
      write_frame_size_with_refs
                (in_stack_ffffffffffffff40,(aom_write_bit_buffer *)in_stack_ffffffffffffff38);
    }
    else {
      write_frame_size((AV1_COMMON *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                       (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                       (aom_write_bit_buffer *)in_stack_ffffffffffffff40);
    }
    if ((*(byte *)((long)in_RDI + 0x3c16e) & 1) == 0) {
      aom_wb_write_bit((aom_write_bit_buffer *)in_RCX,(uint)(*(byte *)((long)in_RDI + 0x3c16d) & 1))
      ;
    }
    write_frame_interp_filter
              ((InterpFilter)((ulong)in_stack_ffffffffffffff30 >> 0x38),
               (aom_write_bit_buffer *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
              );
    aom_wb_write_bit((aom_write_bit_buffer *)in_RCX,(uint)(*(byte *)((long)in_RDI + 0x3c177) & 1));
    iVar1 = frame_might_allow_ref_frame_mvs(in_stack_ffffffffffffff30);
    if (iVar1 != 0) {
      aom_wb_write_bit((aom_write_bit_buffer *)in_RCX,(uint)(*(byte *)((long)in_RDI + 0x3c172) & 1))
      ;
    }
  }
  bVar3 = 0;
  if (*(char *)(lVar4 + 0x3a) == '\0') {
    bVar3 = *(byte *)((long)in_RDI + 0x3c16c) ^ 0xff;
  }
  if ((bVar3 & 1) != 0) {
    aom_wb_write_bit((aom_write_bit_buffer *)in_RCX,
                     (uint)(*(char *)((long)in_RDI + 0x3c184) == '\0'));
  }
  write_tile_info(in_stack_ffffffffffffff30,
                  (aom_write_bit_buffer *)
                  CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                  (aom_write_bit_buffer *)0x1e4836);
  wb_00 = paVar2;
  av1_num_planes(cm_01);
  encode_quantization((CommonQuantParams *)in_stack_ffffffffffffff40,
                      (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                      SUB81((ulong)in_stack_ffffffffffffff38 >> 0x18,0),
                      (aom_write_bit_buffer *)in_stack_ffffffffffffff30);
  encode_segmentation((AV1_COMMON *)CONCAT17(bVar3,in_stack_ffffffffffffff50),wb_00);
  cpi_00 = (AV1_COMP *)&cm_01->delta_q_info;
  if ((0 < *(int *)&paVar2->bit_buffer) &&
     (aom_wb_write_bit((aom_write_bit_buffer *)in_RCX,((DeltaQInfo *)cpi_00)->delta_q_present_flag),
     iVar1._0_1_ = *(FRAME_TYPE *)&cpi_00->ppi,
     iVar1._1_1_ = *(REFERENCE_MODE *)((long)&cpi_00->ppi + 1),
     iVar1._2_2_ = *(undefined2 *)((long)&cpi_00->ppi + 2), iVar1 != 0)) {
    in_stack_ffffffffffffff40 = in_RCX;
    get_msb(((CurrentFrame *)&cpi_00->ppi)->order_hint);
    aom_wb_write_literal
              ((aom_write_bit_buffer *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
               in_stack_ffffffffffffff28);
    in_RSI->current_base_qindex = *(int *)&paVar2->bit_buffer;
    if ((*(byte *)(in_RDI + 0x782e) & 1) == 0) {
      aom_wb_write_bit((aom_write_bit_buffer *)in_RCX,*(uint *)&cpi_00->field_0x8);
    }
    if (*(uint *)&cpi_00->field_0x8 != 0) {
      in_stack_ffffffffffffff30 = in_RCX;
      get_msb(*(uint *)&cpi_00->field_0xc);
      aom_wb_write_literal
                ((aom_write_bit_buffer *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                 in_stack_ffffffffffffff28);
      in_stack_ffffffffffffff38 = in_RSI;
      aom_wb_write_bit((aom_write_bit_buffer *)in_RCX,
                       *(uint *)(cpi_00->enc_quant_dequant_params).quants.y_quant[0]);
      iVar1 = av1_num_planes(cm_01);
      av1_reset_loop_filter_delta(in_stack_ffffffffffffff38,iVar1);
    }
  }
  if ((*(byte *)((long)in_RDI + 0x3c174) & 1) == 0) {
    if ((*(byte *)((long)in_RDI + 0x3c173) & 1) == 0) {
      encode_loopfilter((AV1_COMMON *)cpi_00,
                        (aom_write_bit_buffer *)
                        CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      encode_cdef(in_stack_ffffffffffffff30,
                  (aom_write_bit_buffer *)
                  CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    }
    encode_restoration_mode
              ((AV1_COMMON *)cpi_00,
               (aom_write_bit_buffer *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
              );
  }
  if ((*(byte *)((long)in_RDI + 0x3c173) & 1) == 0) {
    aom_wb_write_bit((aom_write_bit_buffer *)in_RCX,(uint)((char)in_RDI[0x782f] == '\x02'));
  }
  iVar1 = frame_is_intra_only(cm_01);
  if (iVar1 == 0) {
    in_stack_ffffffffffffff6c = (uint)(*(char *)((long)in_RDI + 0x3bf81) == '\x02');
    aom_wb_write_bit((aom_write_bit_buffer *)in_RCX,in_stack_ffffffffffffff6c);
  }
  if (*(int *)((long)in_RDI + 0x3bf94) != 0) {
    aom_wb_write_bit((aom_write_bit_buffer *)in_RCX,(int)in_RDI[0x77f3]);
  }
  iVar1 = frame_might_allow_warped_motion(in_stack_ffffffffffffff30);
  if (iVar1 != 0) {
    aom_wb_write_bit((aom_write_bit_buffer *)in_RCX,(uint)(*(byte *)((long)in_RDI + 0x3c171) & 1));
  }
  aom_wb_write_bit((aom_write_bit_buffer *)in_RCX,(uint)(*(byte *)((long)in_RDI + 0x3c175) & 1));
  iVar1 = frame_is_intra_only(cm_01);
  if (iVar1 == 0) {
    write_global_motion((AV1_COMP *)CONCAT17(bVar3,in_stack_ffffffffffffff50),wb_00);
  }
  if ((*(char *)(lVar4 + 0x6d) != '\0') &&
     ((cm_01->show_frame != 0 || (cm_01->showable_frame != 0)))) {
    write_film_grain_params
              (cpi_00,(aom_write_bit_buffer *)
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  }
  if ((cm_01->tiles).large_scale != 0) {
    write_ext_tile_info(in_stack_ffffffffffffff40,(aom_write_bit_buffer *)in_stack_ffffffffffffff38,
                        (aom_write_bit_buffer *)in_stack_ffffffffffffff30);
  }
  return;
}

Assistant:

static inline void write_uncompressed_header_obu(
    AV1_COMP *cpi, MACROBLOCKD *const xd, struct aom_write_bit_buffer *saved_wb,
    struct aom_write_bit_buffer *wb) {
  AV1_COMMON *const cm = &cpi->common;
  const SequenceHeader *const seq_params = cm->seq_params;
  const CommonQuantParams *quant_params = &cm->quant_params;
  CurrentFrame *const current_frame = &cm->current_frame;
  FeatureFlags *const features = &cm->features;

  if (!cpi->sf.rt_sf.enable_ref_short_signaling ||
      !seq_params->order_hint_info.enable_order_hint ||
      seq_params->order_hint_info.enable_ref_frame_mvs) {
    current_frame->frame_refs_short_signaling = 0;
  } else {
    current_frame->frame_refs_short_signaling = 1;
  }

  if (seq_params->still_picture) {
    assert(cm->show_existing_frame == 0);
    assert(cm->show_frame == 1);
    assert(current_frame->frame_type == KEY_FRAME);
  }
  if (!seq_params->reduced_still_picture_hdr) {
    if (encode_show_existing_frame(cm)) {
      aom_wb_write_bit(wb, 1);  // show_existing_frame
      aom_wb_write_literal(wb, cpi->existing_fb_idx_to_show, 3);

      if (seq_params->decoder_model_info_present_flag &&
          seq_params->timing_info.equal_picture_interval == 0) {
        write_tu_pts_info(cm, wb);
      }
      if (seq_params->frame_id_numbers_present_flag) {
        int frame_id_len = seq_params->frame_id_length;
        int display_frame_id = cm->ref_frame_id[cpi->existing_fb_idx_to_show];
        aom_wb_write_literal(wb, display_frame_id, frame_id_len);
      }
      return;
    } else {
      aom_wb_write_bit(wb, 0);  // show_existing_frame
    }

    aom_wb_write_literal(wb, current_frame->frame_type, 2);

    aom_wb_write_bit(wb, cm->show_frame);
    if (cm->show_frame) {
      if (seq_params->decoder_model_info_present_flag &&
          seq_params->timing_info.equal_picture_interval == 0)
        write_tu_pts_info(cm, wb);
    } else {
      aom_wb_write_bit(wb, cm->showable_frame);
    }
    if (frame_is_sframe(cm)) {
      assert(features->error_resilient_mode);
    } else if (!(current_frame->frame_type == KEY_FRAME && cm->show_frame)) {
      aom_wb_write_bit(wb, features->error_resilient_mode);
    }
  }
  aom_wb_write_bit(wb, features->disable_cdf_update);

  if (seq_params->force_screen_content_tools == 2) {
    aom_wb_write_bit(wb, features->allow_screen_content_tools);
  } else {
    assert(features->allow_screen_content_tools ==
           seq_params->force_screen_content_tools);
  }

  if (features->allow_screen_content_tools) {
    if (seq_params->force_integer_mv == 2) {
      aom_wb_write_bit(wb, features->cur_frame_force_integer_mv);
    } else {
      assert(features->cur_frame_force_integer_mv ==
             seq_params->force_integer_mv);
    }
  } else {
    assert(features->cur_frame_force_integer_mv == 0);
  }

  int frame_size_override_flag = 0;

  if (seq_params->reduced_still_picture_hdr) {
    assert(cm->superres_upscaled_width == seq_params->max_frame_width &&
           cm->superres_upscaled_height == seq_params->max_frame_height);
  } else {
    if (seq_params->frame_id_numbers_present_flag) {
      int frame_id_len = seq_params->frame_id_length;
      aom_wb_write_literal(wb, cm->current_frame_id, frame_id_len);
    }

    if (cm->superres_upscaled_width > seq_params->max_frame_width ||
        cm->superres_upscaled_height > seq_params->max_frame_height) {
      aom_internal_error(cm->error, AOM_CODEC_UNSUP_BITSTREAM,
                         "Frame dimensions are larger than the maximum values");
    }

    frame_size_override_flag =
        frame_is_sframe(cm)
            ? 1
            : (cm->superres_upscaled_width != seq_params->max_frame_width ||
               cm->superres_upscaled_height != seq_params->max_frame_height);
    if (!frame_is_sframe(cm)) aom_wb_write_bit(wb, frame_size_override_flag);

    if (seq_params->order_hint_info.enable_order_hint)
      aom_wb_write_literal(
          wb, current_frame->order_hint,
          seq_params->order_hint_info.order_hint_bits_minus_1 + 1);

    if (!features->error_resilient_mode && !frame_is_intra_only(cm)) {
      aom_wb_write_literal(wb, features->primary_ref_frame, PRIMARY_REF_BITS);
    }
  }

  if (seq_params->decoder_model_info_present_flag) {
    aom_wb_write_bit(wb, cpi->ppi->buffer_removal_time_present);
    if (cpi->ppi->buffer_removal_time_present) {
      for (int op_num = 0;
           op_num < seq_params->operating_points_cnt_minus_1 + 1; op_num++) {
        if (seq_params->op_params[op_num].decoder_model_param_present_flag) {
          if (seq_params->operating_point_idc[op_num] == 0 ||
              ((seq_params->operating_point_idc[op_num] >>
                cm->temporal_layer_id) &
                   0x1 &&
               (seq_params->operating_point_idc[op_num] >>
                (cm->spatial_layer_id + 8)) &
                   0x1)) {
            aom_wb_write_unsigned_literal(
                wb, cm->buffer_removal_times[op_num],
                seq_params->decoder_model_info.buffer_removal_time_length);
            cm->buffer_removal_times[op_num]++;
            if (cm->buffer_removal_times[op_num] == 0) {
              aom_internal_error(cm->error, AOM_CODEC_UNSUP_BITSTREAM,
                                 "buffer_removal_time overflowed");
            }
          }
        }
      }
    }
  }

  // Shown keyframes and switch-frames automatically refreshes all reference
  // frames.  For all other frame types, we need to write refresh_frame_flags.
  if ((current_frame->frame_type == KEY_FRAME && !cm->show_frame) ||
      current_frame->frame_type == INTER_FRAME ||
      current_frame->frame_type == INTRA_ONLY_FRAME)
    aom_wb_write_literal(wb, current_frame->refresh_frame_flags, REF_FRAMES);

  if (!frame_is_intra_only(cm) || current_frame->refresh_frame_flags != 0xff) {
    // Write all ref frame order hints if error_resilient_mode == 1
    if (features->error_resilient_mode &&
        seq_params->order_hint_info.enable_order_hint) {
      for (int ref_idx = 0; ref_idx < REF_FRAMES; ref_idx++) {
        aom_wb_write_literal(
            wb, cm->ref_frame_map[ref_idx]->order_hint,
            seq_params->order_hint_info.order_hint_bits_minus_1 + 1);
      }
    }
  }

  if (current_frame->frame_type == KEY_FRAME) {
    write_frame_size(cm, frame_size_override_flag, wb);
    assert(!av1_superres_scaled(cm) || !features->allow_intrabc);
    if (features->allow_screen_content_tools && !av1_superres_scaled(cm))
      aom_wb_write_bit(wb, features->allow_intrabc);
  } else {
    if (current_frame->frame_type == INTRA_ONLY_FRAME) {
      write_frame_size(cm, frame_size_override_flag, wb);
      assert(!av1_superres_scaled(cm) || !features->allow_intrabc);
      if (features->allow_screen_content_tools && !av1_superres_scaled(cm))
        aom_wb_write_bit(wb, features->allow_intrabc);
    } else if (current_frame->frame_type == INTER_FRAME ||
               frame_is_sframe(cm)) {
      MV_REFERENCE_FRAME ref_frame;

      // NOTE: Error resilient mode turns off frame_refs_short_signaling
      //       automatically.
#define FRAME_REFS_SHORT_SIGNALING 0
#if FRAME_REFS_SHORT_SIGNALING
      current_frame->frame_refs_short_signaling =
          seq_params->order_hint_info.enable_order_hint;
#endif  // FRAME_REFS_SHORT_SIGNALING

      if (current_frame->frame_refs_short_signaling) {
        //    In rtc case when cpi->sf.rt_sf.enable_ref_short_signaling is true,
        //    we turn on frame_refs_short_signaling when the current frame and
        //    golden frame are in the same order_hint group, and their relative
        //    distance is <= 64 (in order to be decodable).

        //    For other cases, an example solution for encoder-side
        //    implementation on frame_refs_short_signaling is also provided in
        //    this function, where frame_refs_short_signaling is only turned on
        //    when the encoder side decision on ref frames is identical to that
        //    at the decoder side.

        current_frame->frame_refs_short_signaling =
            check_frame_refs_short_signaling(
                cm, cpi->sf.rt_sf.enable_ref_short_signaling);
      }

      if (seq_params->order_hint_info.enable_order_hint)
        aom_wb_write_bit(wb, current_frame->frame_refs_short_signaling);

      if (current_frame->frame_refs_short_signaling) {
        const int lst_ref = get_ref_frame_map_idx(cm, LAST_FRAME);
        aom_wb_write_literal(wb, lst_ref, REF_FRAMES_LOG2);

        const int gld_ref = get_ref_frame_map_idx(cm, GOLDEN_FRAME);
        aom_wb_write_literal(wb, gld_ref, REF_FRAMES_LOG2);
      }
      int first_ref_map_idx = INVALID_IDX;
      if (cpi->ppi->rtc_ref.set_ref_frame_config) {
        for (ref_frame = LAST_FRAME; ref_frame <= ALTREF_FRAME; ++ref_frame) {
          if (cpi->ppi->rtc_ref.reference[ref_frame - 1] == 1) {
            first_ref_map_idx = cpi->ppi->rtc_ref.ref_idx[ref_frame - 1];
            break;
          }
        }
      }
      for (ref_frame = LAST_FRAME; ref_frame <= ALTREF_FRAME; ++ref_frame) {
        assert(get_ref_frame_map_idx(cm, ref_frame) != INVALID_IDX);
        if (!current_frame->frame_refs_short_signaling) {
          if (cpi->ppi->rtc_ref.set_ref_frame_config &&
              first_ref_map_idx != INVALID_IDX &&
              cpi->svc.number_spatial_layers == 1 &&
              !seq_params->order_hint_info.enable_order_hint) {
            // For the usage of set_ref_frame_config:
            // for any reference not used set their ref_map_idx
            // to the first used reference.
            const int map_idx = cpi->ppi->rtc_ref.reference[ref_frame - 1]
                                    ? get_ref_frame_map_idx(cm, ref_frame)
                                    : first_ref_map_idx;
            aom_wb_write_literal(wb, map_idx, REF_FRAMES_LOG2);
          } else {
            aom_wb_write_literal(wb, get_ref_frame_map_idx(cm, ref_frame),
                                 REF_FRAMES_LOG2);
          }
        }
        if (seq_params->frame_id_numbers_present_flag) {
          int i = get_ref_frame_map_idx(cm, ref_frame);
          int frame_id_len = seq_params->frame_id_length;
          int diff_len = seq_params->delta_frame_id_length;
          int delta_frame_id_minus_1 =
              ((cm->current_frame_id - cm->ref_frame_id[i] +
                (1 << frame_id_len)) %
               (1 << frame_id_len)) -
              1;
          if (delta_frame_id_minus_1 < 0 ||
              delta_frame_id_minus_1 >= (1 << diff_len)) {
            aom_internal_error(cm->error, AOM_CODEC_ERROR,
                               "Invalid delta_frame_id_minus_1");
          }
          aom_wb_write_literal(wb, delta_frame_id_minus_1, diff_len);
        }
      }

      if (!features->error_resilient_mode && frame_size_override_flag) {
        write_frame_size_with_refs(cm, wb);
      } else {
        write_frame_size(cm, frame_size_override_flag, wb);
      }

      if (!features->cur_frame_force_integer_mv)
        aom_wb_write_bit(wb, features->allow_high_precision_mv);
      write_frame_interp_filter(features->interp_filter, wb);
      aom_wb_write_bit(wb, features->switchable_motion_mode);
      if (frame_might_allow_ref_frame_mvs(cm)) {
        aom_wb_write_bit(wb, features->allow_ref_frame_mvs);
      } else {
        assert(features->allow_ref_frame_mvs == 0);
      }
    }
  }

  const int might_bwd_adapt = !(seq_params->reduced_still_picture_hdr) &&
                              !(features->disable_cdf_update);
  if (cm->tiles.large_scale)
    assert(features->refresh_frame_context == REFRESH_FRAME_CONTEXT_DISABLED);

  if (might_bwd_adapt) {
    aom_wb_write_bit(
        wb, features->refresh_frame_context == REFRESH_FRAME_CONTEXT_DISABLED);
  }

  write_tile_info(cm, saved_wb, wb);
  encode_quantization(quant_params, av1_num_planes(cm),
                      cm->seq_params->separate_uv_delta_q, wb);
  encode_segmentation(cm, wb);

  const DeltaQInfo *const delta_q_info = &cm->delta_q_info;
  if (delta_q_info->delta_q_present_flag) assert(quant_params->base_qindex > 0);
  if (quant_params->base_qindex > 0) {
    aom_wb_write_bit(wb, delta_q_info->delta_q_present_flag);
    if (delta_q_info->delta_q_present_flag) {
      aom_wb_write_literal(wb, get_msb(delta_q_info->delta_q_res), 2);
      xd->current_base_qindex = quant_params->base_qindex;
      if (features->allow_intrabc)
        assert(delta_q_info->delta_lf_present_flag == 0);
      else
        aom_wb_write_bit(wb, delta_q_info->delta_lf_present_flag);
      if (delta_q_info->delta_lf_present_flag) {
        aom_wb_write_literal(wb, get_msb(delta_q_info->delta_lf_res), 2);
        aom_wb_write_bit(wb, delta_q_info->delta_lf_multi);
        av1_reset_loop_filter_delta(xd, av1_num_planes(cm));
      }
    }
  }

  if (features->all_lossless) {
    assert(!av1_superres_scaled(cm));
  } else {
    if (!features->coded_lossless) {
      encode_loopfilter(cm, wb);
      encode_cdef(cm, wb);
    }
    encode_restoration_mode(cm, wb);
  }

  // Write TX mode
  if (features->coded_lossless)
    assert(features->tx_mode == ONLY_4X4);
  else
    aom_wb_write_bit(wb, features->tx_mode == TX_MODE_SELECT);

  if (!frame_is_intra_only(cm)) {
    const int use_hybrid_pred =
        current_frame->reference_mode == REFERENCE_MODE_SELECT;

    aom_wb_write_bit(wb, use_hybrid_pred);
  }

  if (current_frame->skip_mode_info.skip_mode_allowed)
    aom_wb_write_bit(wb, current_frame->skip_mode_info.skip_mode_flag);

  if (frame_might_allow_warped_motion(cm))
    aom_wb_write_bit(wb, features->allow_warped_motion);
  else
    assert(!features->allow_warped_motion);

  aom_wb_write_bit(wb, features->reduced_tx_set_used);

  if (!frame_is_intra_only(cm)) write_global_motion(cpi, wb);

  if (seq_params->film_grain_params_present &&
      (cm->show_frame || cm->showable_frame))
    write_film_grain_params(cpi, wb);

  if (cm->tiles.large_scale) write_ext_tile_info(cm, saved_wb, wb);
}